

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

shared_ptr<helics::Core> helics::CoreFactory::findJoinableCoreOfType(CoreType type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Core> sVar2;
  undefined8 local_28;
  undefined8 uStack_20;
  code *local_18;
  code *local_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_28 = 0;
  uStack_20 = 0;
  local_10 = std::
             _Function_handler<bool_(const_std::shared_ptr<helics::Core>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreFactory.cpp:330:39)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_std::shared_ptr<helics::Core>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreFactory.cpp:330:39)>
             ::_M_manager;
  sVar2 = gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::findObject
                    ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)
                     CONCAT44(in_register_0000003c,type),
                     (function<bool_(const_std::shared_ptr<helics::Core>_&)> *)searchableCores,
                     (CoreType)&local_28);
  _Var1 = sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi
  ;
  sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(in_register_0000003c,type);
  return (shared_ptr<helics::Core>)
         sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> findJoinableCoreOfType(CoreType type)
{
    return searchableCores.findObject([](auto& ptr) { return ptr->isOpenToNewFederates(); }, type);
}